

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options<char>::basic_json_options
          (basic_json_options<char> *this,basic_json_options<char> *param_2)

{
  void **in_RDI;
  basic_json_encode_options<char> *in_stack_ffffffffffffffe0;
  
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)this,(basic_json_options_common<char> *)param_2);
  basic_json_decode_options<char>::basic_json_decode_options
            ((basic_json_decode_options<char> *)in_stack_ffffffffffffffe0,in_RDI,
             (basic_json_decode_options<char> *)0x31425e);
  basic_json_encode_options<char>::basic_json_encode_options
            (in_stack_ffffffffffffffe0,in_RDI,(basic_json_encode_options<char> *)0x31427d);
  *in_RDI = vtable + 0x18;
  in_RDI[0xe] = vtable + 0x68;
  in_RDI[6] = vtable + 0x40;
  return;
}

Assistant:

basic_json_options(const basic_json_options&) = default;